

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O0

void icu_63::_set_addString(USet *set,UChar *str,int32_t length)

{
  ConstChar16Ptr local_68;
  UnicodeString local_60;
  int32_t local_1c;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *str_local;
  USet *set_local;
  
  local_1c = length;
  pUStack_18 = str;
  str_local = (UChar *)set;
  ConstChar16Ptr::ConstChar16Ptr(&local_68,str);
  UnicodeString::UnicodeString(&local_60,(byte)((uint)length >> 0x1f),&local_68,local_1c);
  UnicodeSet::add((UnicodeSet *)set,&local_60);
  UnicodeString::~UnicodeString(&local_60);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  return;
}

Assistant:

static void U_CALLCONV
_set_addString(USet *set, const UChar *str, int32_t length) {
    ((UnicodeSet *)set)->add(UnicodeString((UBool)(length<0), str, length));
}